

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

int xc_maximum_name_length(void)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  xc_functional_key_t *__s;
  bool bVar6;
  
  uVar1 = xc_number_of_functionals();
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  __s = xc_functional_keys;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    uVar1 = (uint)uVar5;
    if (bVar6) break;
    sVar3 = strlen(__s->name);
    uVar2 = (uint)sVar3;
    if ((int)(uint)sVar3 < (int)uVar1) {
      uVar2 = uVar1;
    }
    __s = __s + 1;
    uVar5 = (ulong)uVar2;
  }
  return uVar1;
}

Assistant:

int xc_maximum_name_length(void)
{
  int i, N, maxlen, tmp;

  N=xc_number_of_functionals();

  maxlen=0;
  for(i=0;i<N;i++){
    tmp=strlen(xc_functional_keys[i].name);
    if(tmp > maxlen) maxlen=tmp;
  }

  return maxlen;
}